

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void duckdb::DecimalRoundPositivePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  hugeint_t *phVar1;
  hugeint_t *phVar2;
  long lVar3;
  idx_t idx;
  byte bVar4;
  BoundFunctionExpression *pBVar5;
  pointer pFVar6;
  const_reference this;
  pointer pEVar7;
  reference vector;
  UnifiedVectorFormat *pUVar8;
  UnifiedVectorFormat *pUVar9;
  undefined8 *idx_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  ulong uVar11;
  TemplatedValidityMask<unsigned_long> *other;
  long lVar12;
  ulong uVar13;
  UnifiedVectorFormat *pUVar14;
  VectorType VVar15;
  void *in_R8;
  long lVar16;
  int64_t *piVar17;
  ulong uVar18;
  ulong uVar19;
  UnifiedVectorFormat *pUVar20;
  bool bVar21;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  hugeint_t input_03;
  hugeint_t hVar22;
  ValidityMask local_c8;
  long local_a8;
  hugeint_t local_a0;
  long local_90;
  hugeint_t local_58;
  hugeint_t addition;
  
  pBVar5 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pFVar6 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                       *)(pBVar5 + 0x198));
  this = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
         ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                      *)(pBVar5 + 0x180),0);
  pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this);
  bVar4 = duckdb::DecimalType::GetScale((LogicalType *)(pEVar7 + 0x38));
  idx_00 = &Hugeint::POWERS_OF_TEN;
  local_58.lower = (&Hugeint::POWERS_OF_TEN)[((ulong)bVar4 - (long)*(int *)(pFVar6 + 8)) * 2];
  local_58.upper =
       *(int64_t *)
        (duckdb::hugeint_t::operator&= + ((ulong)bVar4 - (long)*(int *)(pFVar6 + 8)) * 0x10);
  duckdb::hugeint_t::hugeint_t(&local_a0,2);
  addition = (hugeint_t)duckdb::hugeint_t::operator/(&local_58,&local_a0);
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,0);
  pUVar14 = *(UnifiedVectorFormat **)(input + 0x18);
  VVar15 = (VectorType)result;
  local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask = &addition.lower;
  local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&local_58;
  if (*vector == (value_type)0x0) {
    duckdb::Vector::SetVectorType(VVar15);
    lVar16 = *(long *)(result + 0x20);
    lVar3 = *(long *)(vector + 0x20);
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    if (*(long *)(vector + 0x28) == 0) {
      lVar12 = 8;
      while (bVar21 = pUVar14 != (UnifiedVectorFormat *)0x0, pUVar14 = pUVar14 + -1, bVar21) {
        hVar22.upper = *(int64_t *)(lVar3 + lVar12);
        hVar22.lower = *(uint64_t *)(lVar3 + -8 + lVar12);
        hVar22 = UnaryLambdaWrapper::
                 Operation<duckdb::DecimalRoundPositivePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_,duckdb::hugeint_t,duckdb::hugeint_t>
                           (hVar22,&local_c8,(idx_t)idx_00,in_R8);
        *(uint64_t *)(lVar16 + -8 + lVar12) = hVar22.lower;
        *(int64_t *)(lVar16 + lVar12) = hVar22.upper;
        lVar12 = lVar12 + 0x10;
      }
    }
    else {
      other = (TemplatedValidityMask<unsigned_long> *)(vector + 0x28);
      TemplatedValidityMask<unsigned_long>::Initialize
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),other);
      local_c8.super_TemplatedValidityMask<unsigned_long>.capacity = (ulong)(pUVar14 + 0x3f) >> 6;
      pUVar20 = (UnifiedVectorFormat *)0x0;
      local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)other;
      local_a8 = lVar16;
      for (uVar11 = 0; uVar11 != local_c8.super_TemplatedValidityMask<unsigned_long>.capacity;
          uVar11 = uVar11 + 1) {
        if (other->validity_mask == (unsigned_long *)0x0) {
          pUVar9 = pUVar20 + 0x40;
          if (pUVar14 <= pUVar20 + 0x40) {
            pUVar9 = pUVar14;
          }
LAB_0074888b:
          uVar18 = (long)pUVar20 << 4 | 8;
          for (; pUVar8 = pUVar20,
              _Var10._M_pi = local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi, pUVar20 < pUVar9; pUVar20 = pUVar20 + 1) {
            input_00.upper = *(int64_t *)(lVar3 + uVar18);
            input_00.lower = *(uint64_t *)(lVar3 + -8 + uVar18);
            hVar22 = UnaryLambdaWrapper::
                     Operation<duckdb::DecimalRoundPositivePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_,duckdb::hugeint_t,duckdb::hugeint_t>
                               (input_00,&local_c8,(idx_t)other,in_R8);
            *(uint64_t *)(lVar16 + -8 + uVar18) = hVar22.lower;
            *(int64_t *)(lVar16 + uVar18) = hVar22.upper;
            uVar18 = uVar18 + 0x10;
          }
        }
        else {
          uVar18 = other->validity_mask[uVar11];
          pUVar9 = pUVar20 + 0x40;
          if (pUVar14 <= pUVar20 + 0x40) {
            pUVar9 = pUVar14;
          }
          if (uVar18 == 0xffffffffffffffff) goto LAB_0074888b;
          pUVar8 = pUVar9;
          _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)other;
          if (uVar18 != 0) {
            uVar19 = (long)pUVar20 << 4 | 8;
            for (uVar13 = 0; pUVar8 = pUVar20 + uVar13,
                _Var10._M_pi = local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                               internal.
                               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi, pUVar20 + uVar13 < pUVar9; uVar13 = uVar13 + 1) {
              if ((uVar18 >> (uVar13 & 0x3f) & 1) != 0) {
                input_01.upper = *(int64_t *)(lVar3 + uVar19);
                input_01.lower = *(uint64_t *)(lVar3 + -8 + uVar19);
                hVar22 = UnaryLambdaWrapper::
                         Operation<duckdb::DecimalRoundPositivePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_,duckdb::hugeint_t,duckdb::hugeint_t>
                                   (input_01,&local_c8,(idx_t)other,in_R8);
                *(uint64_t *)(local_a8 + -8 + uVar19) = hVar22.lower;
                *(int64_t *)(local_a8 + uVar19) = hVar22.upper;
                lVar16 = local_a8;
              }
              uVar19 = uVar19 + 0x10;
            }
          }
        }
        other = (TemplatedValidityMask<unsigned_long> *)_Var10._M_pi;
        pUVar20 = pUVar8;
      }
    }
  }
  else if (*vector == (value_type)0x2) {
    duckdb::Vector::SetVectorType(VVar15);
    phVar1 = *(hugeint_t **)(result + 0x20);
    phVar2 = *(hugeint_t **)(vector + 0x20);
    if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
      duckdb::ConstantVector::SetNull(result,false);
      hVar22 = UnaryLambdaWrapper::
               Operation<duckdb::DecimalRoundPositivePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_,duckdb::hugeint_t,duckdb::hugeint_t>
                         (*phVar2,&local_c8,(idx_t)idx_00,in_R8);
      *phVar1 = hVar22;
    }
    else {
      duckdb::ConstantVector::SetNull(result,true);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_a0);
    duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar14);
    duckdb::Vector::SetVectorType(VVar15);
    lVar16 = *(long *)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    if (local_90 == 0) {
      piVar17 = (int64_t *)(lVar16 + 8);
      for (pUVar20 = (UnifiedVectorFormat *)0x0; pUVar14 != pUVar20; pUVar20 = pUVar20 + 1) {
        idx = *(idx_t *)local_a0.lower;
        pUVar9 = pUVar20;
        if (idx != 0) {
          pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(idx + (long)pUVar20 * 4);
        }
        input_03.upper = *(int64_t *)(local_a0.upper + 8 + (long)pUVar9 * 0x10);
        input_03.lower = *(uint64_t *)(local_a0.upper + (long)pUVar9 * 0x10);
        hVar22 = UnaryLambdaWrapper::
                 Operation<duckdb::DecimalRoundPositivePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_,duckdb::hugeint_t,duckdb::hugeint_t>
                           (input_03,&local_c8,idx,in_R8);
        piVar17[-1] = hVar22.lower;
        *piVar17 = hVar22.upper;
        piVar17 = piVar17 + 2;
      }
    }
    else {
      piVar17 = (int64_t *)(lVar16 + 8);
      for (pUVar20 = (UnifiedVectorFormat *)0x0; pUVar14 != pUVar20; pUVar20 = pUVar20 + 1) {
        pUVar9 = pUVar20;
        if (*(idx_t *)local_a0.lower != 0) {
          pUVar9 = (UnifiedVectorFormat *)
                   (ulong)*(uint *)(*(idx_t *)local_a0.lower + (long)pUVar20 * 4);
        }
        uVar11 = *(ulong *)(local_90 + ((ulong)pUVar9 >> 6) * 8);
        if ((uVar11 >> ((ulong)pUVar9 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar20);
        }
        else {
          input_02.upper = *(int64_t *)(local_a0.upper + 8 + (long)pUVar9 * 0x10);
          input_02.lower = *(uint64_t *)(local_a0.upper + (long)pUVar9 * 0x10);
          hVar22 = UnaryLambdaWrapper::
                   Operation<duckdb::DecimalRoundPositivePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_,duckdb::hugeint_t,duckdb::hugeint_t>
                             (input_02,&local_c8,uVar11,in_R8);
          piVar17[-1] = hVar22.lower;
          *piVar17 = hVar22.upper;
        }
        piVar17 = piVar17 + 2;
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_a0);
  }
  return;
}

Assistant:

static void DecimalRoundPositivePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[source_scale - info.target_scale]);
	T addition = power_of_ten / 2;
	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / power_of_ten);
	});
}